

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fid_cgap.h
# Opt level: O0

double __thiscall bwtil::fid_cgap::entropy(fid_cgap *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  mapped_type *pmVar3;
  reference ppVar4;
  long in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [16];
  undefined1 in_ZMM1 [64];
  pair<const_unsigned_long,_unsigned_long> f;
  iterator __end2;
  iterator __begin2;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *__range2;
  ulint i;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  freqs;
  double H;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffff48;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *in_stack_ffffffffffffff50;
  _Self in_stack_ffffffffffffff88;
  _Self in_stack_ffffffffffffff90;
  ulong local_48;
  ulint in_stack_ffffffffffffffc0;
  fid_cgap *in_stack_ffffffffffffffc8;
  double local_10;
  
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  local_10 = 0.0;
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         *)0x124533);
  for (local_48 = 0; local_48 < *(ulong *)(in_RDI + 0x10); local_48 = local_48 + 1) {
    gapAt(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    pmVar3 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           *)in_stack_ffffffffffffff90._M_node,
                          (key_type *)in_stack_ffffffffffffff88._M_node);
    *pmVar3 = *pmVar3 + 1;
  }
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::begin(in_stack_ffffffffffffff48);
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::end(in_stack_ffffffffffffff48);
  while( true ) {
    auVar5 = auVar6._0_16_;
    auVar7 = in_ZMM1._0_16_;
    bVar2 = std::operator!=((_Self *)&stack0xffffffffffffff90,(_Self *)&stack0xffffffffffffff88);
    if (!bVar2) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_> *)
                        0x124605);
    auVar5 = vcvtusi2sd_avx512f(auVar5,ppVar4->second);
    auVar1 = vcvtusi2sd_avx512f(auVar5,*(undefined8 *)(in_RDI + 0x10));
    auVar7 = vcvtusi2sd_avx512f(auVar7,ppVar4->second);
    auVar6._0_8_ = log2(auVar1._0_8_ / auVar7._0_8_);
    auVar6._8_56_ = extraout_var;
    in_ZMM1 = ZEXT1664(auVar6._0_16_);
    local_10 = auVar5._0_8_ * auVar6._0_8_ + local_10;
    auVar6 = ZEXT864((ulong)local_10);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator++
              (in_stack_ffffffffffffff50);
  }
  auVar5 = vcvtusi2sd_avx512f(auVar7,*(undefined8 *)(in_RDI + 0x10));
  local_10 = local_10 / auVar5._0_8_;
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *)0x12469c);
  return local_10;
}

Assistant:

double entropy(){

		double H=0;
		map<ulint,ulint> freqs;

		for(ulint i=0;i<n;++i)
			freqs[gapAt(i)]++;

		for(auto f : freqs)
			H += f.second * log2((double)n/(double)f.second);

		return H/n;

	}